

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int make_canonical(ly_ctx *ctx,int type,char **value,void *data1,void *data2)

{
  byte bVar1;
  undefined8 *puVar2;
  bool bVar3;
  char **ppcVar4;
  ly_ctx *ctx_00;
  int iVar5;
  int iVar6;
  long lVar7;
  lyxp_expr *expr;
  uint16_t *puVar8;
  long lVar9;
  size_t sVar10;
  ulong uVar11;
  char *pcVar12;
  char *pcVar13;
  long lVar14;
  char cVar15;
  undefined8 uVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  undefined8 uStack_260;
  uint local_258 [128];
  char **local_58;
  long local_50;
  long local_48;
  char *local_40;
  ly_ctx *local_38;
  
  iVar17 = 0;
  local_58 = value;
  local_38 = ctx;
  switch(type) {
  case 2:
    local_258[0] = local_258[0] & 0xffffff00;
    uVar18 = *data2;
    if ((int)*data2 < 1) {
      uVar18 = 0;
    }
    for (uVar19 = 0; uVar18 != uVar19; uVar19 = uVar19 + 1) {
      puVar2 = *(undefined8 **)((long)data1 + uVar19 * 8);
      if (puVar2 != (undefined8 *)0x0) {
        if ((char)local_258[0] == '\0') {
          uStack_260 = 0x124724;
          strcpy((char *)local_258,(char *)*puVar2);
        }
        else {
          uStack_260 = 0x1246f9;
          sVar10 = strlen((char *)local_258);
          uStack_260 = 0x124716;
          sprintf((char *)((long)local_258 + sVar10)," %s",*puVar2);
        }
      }
    }
    break;
  default:
    goto switchD_00124612_caseD_3;
  case 4:
    lVar9 = *data1;
    if (lVar9 == 0) {
      local_258[0] = 0x302e30;
    }
    else {
      bVar1 = *data2;
      uStack_260 = 0x124754;
      iVar17 = sprintf((char *)local_258,"%ld ",lVar9);
      if (iVar17 + -1 <= (int)(uint)bVar1 && 0 < lVar9 || iVar17 + -2 <= (int)(uint)bVar1) {
        uStack_260 = 0x124799;
        iVar17 = sprintf((char *)local_258,"%0*ld ",(ulong)((lVar9 < 1) + 1 + (uint)bVar1),lVar9);
      }
      lVar9 = (long)iVar17;
      lVar7 = lVar9 << 0x20;
      iVar17 = -(uint)bVar1;
      bVar3 = true;
      for (lVar14 = 0; iVar17 != (int)lVar14; lVar14 = lVar14 + -1) {
        if (iVar17 + 1 == (int)lVar14 || !bVar3) {
          cVar15 = *(char *)((long)local_258 + lVar14 + lVar9 + -2);
LAB_001247f1:
          *(char *)((long)local_258 + lVar14 + lVar9 + -0x259 + 600) = cVar15;
          bVar3 = false;
        }
        else {
          cVar15 = *(char *)((long)local_258 + lVar14 + lVar9 + -2);
          if (cVar15 != '0') goto LAB_001247f1;
          *(undefined1 *)((long)local_258 + lVar14 + lVar9 + -0x259 + 600) = 0;
          bVar3 = true;
        }
        lVar7 = lVar7 + -0x100000000;
      }
      *(undefined1 *)((long)local_258 + (lVar7 >> 0x20) + -1) = 0x2e;
    }
    break;
  case 7:
    pcVar12 = *value;
    uStack_260 = 0x1246a1;
    pcVar13 = strchr(pcVar12,0x3a);
    if (pcVar13 == (char *)0x0) {
      uStack_260 = 0x1249e0;
      sprintf((char *)local_258,"%s:%s",data1,pcVar12);
    }
    else {
      uStack_260 = 0x1246b9;
      strcpy((char *)local_258,pcVar12);
    }
    break;
  case 8:
    uStack_260 = 0x12480b;
    expr = lyxp_parse_expr(ctx,*value);
    if (expr == (lyxp_expr *)0x0) {
      uStack_260 = 0x124a19;
      ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
             ,0x404);
      return 0;
    }
    uVar11 = 0;
    local_40 = (char *)0x0;
    uVar19 = 0;
    while( true ) {
      lVar9 = (long)(int)uVar19;
      if (expr->used <= uVar11) break;
      puVar8 = expr->tok_len;
      pcVar12 = expr->expr + expr->expr_pos[uVar11];
      if ((uVar11 != 0) &&
         (pcVar13 = expr->expr + (ulong)puVar8[uVar11 - 1] + (ulong)expr->expr_pos[uVar11 - 1],
         pcVar13 != pcVar12)) {
        uVar19 = ((long)pcVar12 - (long)pcVar13) + lVar9;
        if (0x1ff < (long)uVar19) {
          uVar16 = 0x40e;
          goto LAB_00124ae2;
        }
        uStack_260 = 0x12488e;
        strncpy((char *)((long)local_258 + lVar9),pcVar13,(long)pcVar12 - (long)pcVar13);
        puVar8 = expr->tok_len;
      }
      iVar17 = (int)uVar19;
      lVar9 = (long)iVar17;
      if (expr->tokens[uVar11] == LYXP_TOKEN_NAMETEST) {
        uStack_260 = 0x1248b7;
        local_50 = (long)iVar17;
        pcVar13 = strnchr(pcVar12,0x3a,(uint)puVar8[uVar11]);
        if (pcVar13 == (char *)0x0) {
          puVar8 = expr->tok_len;
          lVar9 = local_50;
          goto LAB_0012496f;
        }
        local_48 = (long)(pcVar13 + 1) - (long)pcVar12;
        if (local_40 == (char *)0x0) {
LAB_001248ec:
          iVar17 = iVar17 + (int)local_48;
          if (0x1ff < iVar17) {
            uVar16 = 0x41e;
            goto LAB_00124ae2;
          }
          uStack_260 = 0x124916;
          strncpy((char *)((long)local_258 + local_50),pcVar12,(long)(int)local_48);
          iVar5 = (int)local_48;
        }
        else {
          uStack_260 = 0x1248e4;
          iVar6 = strncmp(pcVar12,local_40,(long)(int)local_48);
          iVar5 = (int)local_48;
          if (iVar6 != 0) goto LAB_001248ec;
        }
        sVar10 = (ulong)expr->tok_len[uVar11] - (long)iVar5;
        if (0x1ff < (int)sVar10 + iVar17) {
          uVar16 = 0x429;
          goto LAB_00124ae2;
        }
        uStack_260 = 0x124951;
        strncpy((char *)((long)local_258 + (long)iVar17),pcVar13 + 1,sVar10);
        uVar18 = (iVar17 - iVar5) + (uint)expr->tok_len[uVar11];
        local_40 = pcVar12;
      }
      else {
LAB_0012496f:
        if (0x1ff < (int)(iVar17 + (uint)puVar8[uVar11])) {
          uVar16 = 0x431;
          goto LAB_00124ae2;
        }
        uStack_260 = 0x1249a0;
        strncpy((char *)((long)local_258 + lVar9),expr->expr + expr->expr_pos[uVar11],
                (ulong)puVar8[uVar11]);
        uVar18 = iVar17 + (uint)expr->tok_len[uVar11];
      }
      uVar19 = (ulong)uVar18;
      uVar11 = uVar11 + 1;
    }
    if (0x1ff < (int)uVar19) {
      uVar16 = 0x43a;
LAB_00124ae2:
      uStack_260 = 0x124ae9;
      ly_log(local_38,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
             ,uVar16);
      uStack_260 = 0x124af1;
      lyxp_expr_free(expr);
      return 0;
    }
    *(undefined1 *)((long)local_258 + lVar9) = 0;
    uStack_260 = 0x124a7c;
    lyxp_expr_free(expr);
    break;
  case 0xc:
  case 0xe:
  case 0x10:
  case 0x12:
    uVar16 = *data1;
    pcVar12 = "%ld";
    goto LAB_0012462c;
  case 0xd:
  case 0xf:
  case 0x11:
  case 0x13:
    uVar16 = *data1;
    pcVar12 = "%lu";
LAB_0012462c:
    uStack_260 = 0x12463a;
    sprintf((char *)local_258,pcVar12,uVar16);
  }
  ppcVar4 = local_58;
  pcVar12 = *local_58;
  uStack_260 = 0x124650;
  iVar5 = strcmp((char *)local_258,pcVar12);
  ctx_00 = local_38;
  iVar17 = 0;
  if (iVar5 != 0) {
    uStack_260 = 0x124668;
    lydict_remove(local_38,pcVar12);
    uStack_260 = 0x124679;
    pcVar12 = lydict_insert(ctx_00,(char *)local_258,0);
    *ppcVar4 = pcVar12;
    iVar17 = 1;
  }
switchD_00124612_caseD_3:
  return iVar17;
}

Assistant:

static int
make_canonical(struct ly_ctx *ctx, int type, const char **value, void *data1, void *data2)
{
    const uint16_t buf_len = 511;
    char buf[buf_len + 1];
    struct lys_type_bit **bits = NULL;
    struct lyxp_expr *exp;
    const char *module_name, *cur_expr, *end;
    int i, j, count;
    int64_t num;
    uint64_t unum;
    uint8_t c;

    switch (type) {
    case LY_TYPE_BITS:
        bits = (struct lys_type_bit **)data1;
        count = *((int *)data2);
        /* in canonical form, the bits are ordered by their position */
        buf[0] = '\0';
        for (i = 0; i < count; i++) {
            if (!bits[i]) {
                /* bit not set */
                continue;
            }
            if (buf[0]) {
                sprintf(buf + strlen(buf), " %s", bits[i]->name);
            } else {
                strcpy(buf, bits[i]->name);
            }
        }
        break;

    case LY_TYPE_IDENT:
        module_name = (const char *)data1;
        /* identity must always have a prefix */
        if (!strchr(*value, ':')) {
            sprintf(buf, "%s:%s", module_name, *value);
        } else {
            strcpy(buf, *value);
        }
        break;

    case LY_TYPE_INST:
        exp = lyxp_parse_expr(ctx, *value);
        LY_CHECK_ERR_RETURN(!exp, LOGINT(ctx), 0);

        module_name = NULL;
        count = 0;
        for (i = 0; (unsigned)i < exp->used; ++i) {
            cur_expr = &exp->expr[exp->expr_pos[i]];

            /* copy WS */
            if (i && ((end = exp->expr + exp->expr_pos[i - 1] + exp->tok_len[i - 1]) != cur_expr)) {
                if (count + (cur_expr - end) > buf_len) {
                    LOGINT(ctx);
                    lyxp_expr_free(exp);
                    return 0;
                }
                strncpy(&buf[count], end, cur_expr - end);
                count += cur_expr - end;
            }

            if ((exp->tokens[i] == LYXP_TOKEN_NAMETEST) && (end = strnchr(cur_expr, ':', exp->tok_len[i]))) {
                /* get the module name with ":" */
                ++end;
                j = end - cur_expr;

                if (!module_name || strncmp(cur_expr, module_name, j)) {
                    /* print module name with colon, it does not equal to the parent one */
                    if (count + j > buf_len) {
                        LOGINT(ctx);
                        lyxp_expr_free(exp);
                        return 0;
                    }
                    strncpy(&buf[count], cur_expr, j);
                    count += j;
                }
                module_name = cur_expr;

                /* copy the rest */
                if (count + (exp->tok_len[i] - j) > buf_len) {
                    LOGINT(ctx);
                    lyxp_expr_free(exp);
                    return 0;
                }
                strncpy(&buf[count], end, exp->tok_len[i] - j);
                count += exp->tok_len[i] - j;
            } else {
                if (count + exp->tok_len[i] > buf_len) {
                    LOGINT(ctx);
                    lyxp_expr_free(exp);
                    return 0;
                }
                strncpy(&buf[count], &exp->expr[exp->expr_pos[i]], exp->tok_len[i]);
                count += exp->tok_len[i];
            }
        }
        if (count > buf_len) {
            LOGINT(ctx);
            lyxp_expr_free(exp);
            return 0;
        }
        buf[count] = '\0';

        lyxp_expr_free(exp);
        break;

    case LY_TYPE_DEC64:
        num = *((int64_t *)data1);
        c = *((uint8_t *)data2);
        if (num) {
            count = sprintf(buf, "%"PRId64" ", num);
            if ( (num > 0 && (count - 1) <= c)
                 || (count - 2) <= c ) {
                /* we have 0. value, print the value with the leading zeros
                 * (one for 0. and also keep the correct with of num according
                 * to fraction-digits value)
                 * for (num<0) - extra character for '-' sign */
                count = sprintf(buf, "%0*"PRId64" ", (num > 0) ? (c + 1) : (c + 2), num);
            }
            for (i = c, j = 1; i > 0 ; i--) {
                if (j && i > 1 && buf[count - 2] == '0') {
                    /* we have trailing zero to skip */
                    buf[count - 1] = '\0';
                } else {
                    j = 0;
                    buf[count - 1] = buf[count - 2];
                }
                count--;
            }
            buf[count - 1] = '.';
        } else {
            /* zero */
            sprintf(buf, "0.0");
        }
        break;

    case LY_TYPE_INT8:
    case LY_TYPE_INT16:
    case LY_TYPE_INT32:
    case LY_TYPE_INT64:
        num = *((int64_t *)data1);
        sprintf(buf, "%"PRId64, num);
        break;

    case LY_TYPE_UINT8:
    case LY_TYPE_UINT16:
    case LY_TYPE_UINT32:
    case LY_TYPE_UINT64:
        unum = *((uint64_t *)data1);
        sprintf(buf, "%"PRIu64, unum);
        break;

    default:
        /* should not be even called - just do nothing */
        return 0;
    }

    if (strcmp(buf, *value)) {
        lydict_remove(ctx, *value);
        *value = lydict_insert(ctx, buf, 0);
        return 1;
    }

    return 0;
}